

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ast.cpp
# Opt level: O2

void __thiscall hypermind::ASTIfStmt::dump(ASTIfStmt *this,Ostream *os)

{
  element_type *peVar1;
  
  std::operator<<(os,"if  condition : ");
  peVar1 = (this->condition).super___shared_ptr<hypermind::ASTNode,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  (**peVar1->_vptr_ASTNode)(peVar1,os);
  std::endl<char,std::char_traits<char>>(os);
  peVar1 = (this->thenBlock).super___shared_ptr<hypermind::ASTNode,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  (**peVar1->_vptr_ASTNode)(peVar1,os);
  if ((this->elseBlock).super___shared_ptr<hypermind::ASTNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
      (element_type *)0x0) {
    std::operator<<(os," else ");
    peVar1 = (this->elseBlock).super___shared_ptr<hypermind::ASTNode,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr;
    (**peVar1->_vptr_ASTNode)(peVar1,os);
    return;
  }
  return;
}

Assistant:

AST_DUMP(ASTIfStmt) {
        os << _HM_C("if  condition : ");
        condition->dump(os);
        os << std::endl;
        thenBlock->dump(os);
        if (elseBlock != nullptr) {
            os << _HM_C(" else ");
            elseBlock->dump(os);
        }

    }